

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::RsCaseItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::RsCaseItemSyntax>,slang::syntax::SyntaxList<slang::syntax::RsCaseItemSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::RsCaseItemSyntax> *args)

{
  SyntaxList<slang::syntax::RsCaseItemSyntax> *pSVar1;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SyntaxList<slang::syntax::RsCaseItemSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SyntaxList<slang::syntax::RsCaseItemSyntax>::SyntaxList(in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }